

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

int __thiscall ncnn::Gemm_x86::create_pipeline_int8(Gemm_x86 *this,Option *opt)

{
  undefined8 uVar1;
  size_t sVar2;
  void *pvVar3;
  int *piVar4;
  Allocator *pAVar5;
  undefined1 (*pauVar6) [16];
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  undefined1 *puVar20;
  ulong uVar21;
  undefined8 *puVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  Mat *AT;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  undefined1 *puVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  ulong local_168;
  long local_128;
  long local_120;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  undefined8 local_108;
  ulong local_100;
  Mat *local_f8;
  long local_f0;
  uint local_e4;
  ulong local_e0;
  ulong local_d8;
  uint local_d0;
  uint local_cc;
  int local_c8;
  uint local_c4;
  Option *local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  local_c0 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_0047e6c7:
    if ((this->super_Gemm).constantB != 0) {
      uVar9 = (this->super_Gemm).constantN;
      uVar33 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar9,uVar33,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,opt->num_threads);
      local_e4 = (int)(uVar9 + TILE_N + -1) / TILE_N;
      uVar17 = (ulong)(uint)TILE_K;
      local_a0 = (ulong)uVar9;
      Mat::create(&this->BT_data,TILE_N * TILE_K,(int)(TILE_K + uVar33 + -1) / TILE_K,local_e4,1,
                  (Allocator *)0x0);
      opt = local_c0;
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_0047f515;
      if (0 < (int)local_e4) {
        uVar14 = 0;
        do {
          local_98 = uVar14;
          if (0 < (int)uVar33) {
            local_c8 = TILE_N * (int)local_98;
            local_cc = (int)local_a0 - local_c8;
            lVar10 = (long)local_c8;
            local_78 = lVar10 + 7;
            local_80 = lVar10 + 6;
            local_88 = lVar10 + 5;
            local_90 = lVar10 + 4;
            local_a8 = lVar10 + 3;
            local_b0 = lVar10 + 2;
            local_b8 = lVar10 + 1;
            iVar25 = 0;
            do {
              uVar9 = local_cc;
              if (TILE_N < (int)local_cc) {
                uVar9 = TILE_N;
              }
              uVar32 = uVar33 - iVar25;
              uVar30 = (uint)uVar17;
              uVar14 = (ulong)uVar32;
              if ((int)uVar30 < (int)uVar32) {
                uVar14 = uVar17;
              }
              sVar2 = (this->BT_data).elemsize;
              pauVar41 = (undefined1 (*) [16])
                         ((long)(this->BT_data).data +
                         (long)(this->BT_data).w * sVar2 * (long)(iVar25 / (int)uVar30) +
                         (long)(local_c8 / TILE_N) * (this->BT_data).cstep * sVar2);
              uVar18 = (uint)uVar14;
              if ((this->super_Gemm).transB == 0) {
                iVar28 = (this->super_Gemm).B_data.w;
                lVar11 = (long)iVar28;
                uVar17 = 0;
                if (7 < (int)uVar9) {
                  lVar36 = lVar10 + lVar11;
                  lVar23 = lVar10;
                  uVar14 = 0;
                  do {
                    pvVar3 = (this->super_Gemm).B_data.data;
                    lVar34 = (long)(this->super_Gemm).B_data.w * (long)iVar25 *
                             (this->super_Gemm).B_data.elemsize;
                    if ((int)uVar18 < 2) {
                      lVar35 = (long)pvVar3 + lVar10 + uVar14;
                      uVar32 = 0;
                    }
                    else {
                      lVar35 = (long)pvVar3 + lVar23;
                      lVar37 = (long)pvVar3 + lVar36;
                      iVar24 = 1;
                      do {
                        uVar17 = *(ulong *)(lVar35 + lVar34);
                        uVar1 = *(undefined8 *)(lVar37 + lVar34);
                        auVar51._8_6_ = 0;
                        auVar51._0_8_ = uVar17;
                        auVar51[0xe] = (char)(uVar17 >> 0x38);
                        auVar51[0xf] = (char)((ulong)uVar1 >> 0x38);
                        auVar50._14_2_ = auVar51._14_2_;
                        auVar50._8_5_ = 0;
                        auVar50._0_8_ = uVar17;
                        auVar50[0xd] = (char)((ulong)uVar1 >> 0x30);
                        auVar49._13_3_ = auVar50._13_3_;
                        auVar49._8_4_ = 0;
                        auVar49._0_8_ = uVar17;
                        auVar49[0xc] = (char)(uVar17 >> 0x30);
                        auVar48._12_4_ = auVar49._12_4_;
                        auVar48._8_3_ = 0;
                        auVar48._0_8_ = uVar17;
                        auVar48[0xb] = (char)((ulong)uVar1 >> 0x28);
                        auVar47._11_5_ = auVar48._11_5_;
                        auVar47._8_2_ = 0;
                        auVar47._0_8_ = uVar17;
                        auVar47[10] = (char)(uVar17 >> 0x28);
                        auVar46._10_6_ = auVar47._10_6_;
                        auVar46[8] = 0;
                        auVar46._0_8_ = uVar17;
                        auVar46[9] = (char)((ulong)uVar1 >> 0x20);
                        auVar45._9_7_ = auVar46._9_7_;
                        auVar45[8] = (char)(uVar17 >> 0x20);
                        auVar45._0_8_ = uVar17;
                        auVar44._8_8_ = auVar45._8_8_;
                        auVar44[7] = (char)((ulong)uVar1 >> 0x18);
                        auVar44[6] = (char)(uVar17 >> 0x18);
                        auVar44[5] = (char)((ulong)uVar1 >> 0x10);
                        auVar44[4] = (char)(uVar17 >> 0x10);
                        auVar44[3] = (char)((ulong)uVar1 >> 8);
                        auVar44[2] = (char)(uVar17 >> 8);
                        auVar44[0] = (undefined1)uVar17;
                        auVar44[1] = (char)uVar1;
                        *pauVar41 = auVar44;
                        pauVar41 = pauVar41 + 1;
                        lVar35 = lVar35 + iVar28 * 2;
                        lVar37 = lVar37 + iVar28 * 2;
                        iVar24 = iVar24 + 2;
                        uVar32 = uVar18 & 0xfffffffe;
                      } while (iVar24 < (int)uVar18);
                    }
                    puVar22 = (undefined8 *)(lVar35 + lVar34);
                    iVar24 = uVar18 - uVar32;
                    if (iVar24 != 0 && (int)uVar32 <= (int)uVar18) {
                      do {
                        *(undefined8 *)*pauVar41 = *puVar22;
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 8);
                        puVar22 = (undefined8 *)((long)puVar22 + lVar11);
                        iVar24 = iVar24 + -1;
                      } while (iVar24 != 0);
                    }
                    uVar17 = uVar14 + 8;
                    uVar15 = uVar14 + 0xf;
                    lVar23 = lVar23 + 8;
                    lVar36 = lVar36 + 8;
                    uVar14 = uVar17;
                  } while (uVar15 < uVar9);
                }
                if ((int)((uint)uVar17 | 3) < (int)uVar9) {
                  lVar35 = (long)(iVar28 * 2);
                  lVar36 = lVar10 + (uVar17 & 0xffffffff);
                  lVar39 = (iVar28 + 3) + lVar36;
                  lVar34 = (iVar28 + 2) + lVar36;
                  lVar37 = (iVar28 + 1) + lVar36;
                  lVar23 = lVar36 + lVar11;
                  uVar14 = uVar17 & 0xffffffff;
                  do {
                    pvVar3 = (this->super_Gemm).B_data.data;
                    lVar42 = (long)(this->super_Gemm).B_data.w * (long)iVar25 *
                             (this->super_Gemm).B_data.elemsize;
                    if ((int)uVar18 < 2) {
                      lVar38 = (long)pvVar3 + lVar10 + uVar14;
                      uVar32 = 0;
                    }
                    else {
                      lVar38 = lVar36 + (long)pvVar3;
                      lVar19 = lVar39 + (long)pvVar3;
                      lVar27 = lVar34 + (long)pvVar3;
                      lVar16 = lVar37 + (long)pvVar3;
                      lVar40 = (long)pvVar3 + lVar23;
                      iVar24 = 1;
                      do {
                        (*pauVar41)[0] = *(undefined1 *)(lVar38 + lVar42);
                        (*pauVar41)[1] = *(undefined1 *)(lVar40 + lVar42);
                        (*pauVar41)[2] = *(undefined1 *)(lVar38 + 1 + lVar42);
                        (*pauVar41)[3] = *(undefined1 *)(lVar16 + lVar42);
                        (*pauVar41)[4] = *(undefined1 *)(lVar38 + 2 + lVar42);
                        (*pauVar41)[5] = *(undefined1 *)(lVar27 + lVar42);
                        (*pauVar41)[6] = *(undefined1 *)(lVar38 + 3 + lVar42);
                        (*pauVar41)[7] = *(undefined1 *)(lVar19 + lVar42);
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 8);
                        iVar24 = iVar24 + 2;
                        lVar38 = lVar38 + lVar35;
                        lVar19 = lVar19 + lVar35;
                        lVar27 = lVar27 + lVar35;
                        lVar16 = lVar16 + lVar35;
                        lVar40 = lVar40 + lVar35;
                      } while (iVar24 < (int)uVar18);
                      uVar32 = uVar18 & 0xfffffffe;
                    }
                    iVar24 = uVar18 - uVar32;
                    if (iVar24 != 0 && (int)uVar32 <= (int)uVar18) {
                      puVar20 = (undefined1 *)(lVar38 + lVar42 + 3);
                      do {
                        (*pauVar41)[0] = puVar20[-3];
                        (*pauVar41)[1] = puVar20[-2];
                        (*pauVar41)[2] = puVar20[-1];
                        (*pauVar41)[3] = *puVar20;
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                        puVar20 = puVar20 + lVar11;
                        iVar24 = iVar24 + -1;
                      } while (iVar24 != 0);
                    }
                    uVar17 = uVar14 + 4;
                    lVar42 = uVar14 + 7;
                    lVar36 = lVar36 + 4;
                    lVar39 = lVar39 + 4;
                    lVar34 = lVar34 + 4;
                    lVar37 = lVar37 + 4;
                    lVar23 = lVar23 + 4;
                    uVar14 = uVar17;
                  } while (lVar42 < (int)uVar9);
                }
                if ((int)((uint)uVar17 | 1) < (int)uVar9) {
                  lVar35 = (long)(iVar28 * 2);
                  lVar36 = lVar10 + (uVar17 & 0xffffffff);
                  lVar34 = (iVar28 + 1) + lVar36;
                  lVar23 = lVar36 + lVar11;
                  uVar14 = uVar17 & 0xffffffff;
                  do {
                    pvVar3 = (this->super_Gemm).B_data.data;
                    lVar37 = (long)(this->super_Gemm).B_data.w * (long)iVar25 *
                             (this->super_Gemm).B_data.elemsize;
                    if ((int)uVar18 < 2) {
                      lVar39 = (long)pvVar3 + lVar10 + uVar14;
                      uVar32 = 0;
                    }
                    else {
                      lVar39 = (long)pvVar3 + lVar36;
                      lVar42 = (long)pvVar3 + lVar34;
                      lVar38 = (long)pvVar3 + lVar23;
                      iVar28 = 1;
                      do {
                        (*pauVar41)[0] = *(undefined1 *)(lVar39 + lVar37);
                        (*pauVar41)[1] = *(undefined1 *)(lVar38 + lVar37);
                        (*pauVar41)[2] = *(undefined1 *)(lVar39 + 1 + lVar37);
                        (*pauVar41)[3] = *(undefined1 *)(lVar42 + lVar37);
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                        iVar28 = iVar28 + 2;
                        lVar39 = lVar39 + lVar35;
                        lVar42 = lVar42 + lVar35;
                        lVar38 = lVar38 + lVar35;
                      } while (iVar28 < (int)uVar18);
                      uVar32 = uVar18 & 0xfffffffe;
                    }
                    iVar28 = uVar18 - uVar32;
                    if (iVar28 != 0 && (int)uVar32 <= (int)uVar18) {
                      puVar20 = (undefined1 *)(lVar39 + lVar37 + 1);
                      do {
                        (*pauVar41)[0] = puVar20[-1];
                        (*pauVar41)[1] = *puVar20;
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                        puVar20 = puVar20 + lVar11;
                        iVar28 = iVar28 + -1;
                      } while (iVar28 != 0);
                    }
                    uVar17 = uVar14 + 2;
                    lVar37 = uVar14 + 3;
                    lVar36 = lVar36 + 2;
                    lVar34 = lVar34 + 2;
                    lVar23 = lVar23 + 2;
                    uVar14 = uVar17;
                  } while (lVar37 < (int)uVar9);
                }
                if ((int)uVar17 < (int)uVar9) {
                  lVar36 = (long)(int)uVar17;
                  do {
                    if (0 < (int)uVar18) {
                      puVar20 = (undefined1 *)
                                ((long)(this->super_Gemm).B_data.data +
                                lVar10 + lVar36 +
                                (long)(this->super_Gemm).B_data.w * (long)iVar25 *
                                (this->super_Gemm).B_data.elemsize);
                      uVar32 = uVar18;
                      do {
                        (*pauVar41)[0] = *puVar20;
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 1);
                        puVar20 = puVar20 + lVar11;
                        uVar32 = uVar32 - 1;
                      } while (uVar32 != 0);
                    }
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != (int)uVar9);
                }
              }
              else {
                uVar14 = 0;
                if (7 < (int)uVar9) {
                  local_d8 = (ulong)iVar25;
                  local_c4 = uVar18 & 0xfffffffe;
                  local_100 = (ulong)uVar9;
                  local_168 = 0;
                  lVar11 = local_80;
                  lVar36 = local_90;
                  lVar23 = local_b0;
                  uVar15 = local_a8;
                  lVar34 = lVar10;
                  lVar35 = local_b8;
                  uVar7 = local_78;
                  lVar37 = local_88;
                  do {
                    local_108 = uVar7;
                    lVar39 = (long)(this->super_Gemm).B_data.w;
                    sVar2 = (this->super_Gemm).B_data.elemsize;
                    lVar42 = (long)(this->super_Gemm).B_data.data + local_d8;
                    if ((int)uVar18 < 2) {
                      lVar39 = sVar2 * lVar39;
                      lVar38 = (local_168 + lVar10) * lVar39 + lVar42;
                      local_120 = (local_168 + lVar10 + 1) * lVar39 + lVar42;
                      lVar27 = (local_168 + lVar10 + 2) * lVar39 + lVar42;
                      lVar16 = (local_168 + lVar10 + 3) * lVar39 + lVar42;
                      local_f0 = (local_168 + lVar10 + 4) * lVar39 + lVar42;
                      local_128 = (local_168 + lVar10 + 5) * lVar39 + lVar42;
                      local_f8 = (Mat *)((local_168 + lVar10 + 6) * lVar39 + lVar42);
                      lVar39 = (lVar10 + local_168 + 7) * lVar39 + lVar42;
                      uVar13 = 0;
                    }
                    else {
                      local_60 = sVar2 * local_108 * lVar39;
                      lVar40 = sVar2 * lVar11 * lVar39;
                      lVar26 = lVar40 + lVar42;
                      local_128 = sVar2 * lVar37 * lVar39;
                      lVar27 = lVar42 + local_128;
                      local_f0 = sVar2 * lVar36 * lVar39;
                      lVar16 = lVar42 + local_f0;
                      local_48 = sVar2 * uVar15 * lVar39;
                      local_40 = sVar2 * lVar23 * lVar39;
                      local_120 = sVar2 * lVar35 * lVar39;
                      lVar19 = local_120 + lVar42;
                      local_58 = sVar2 * lVar34 * lVar39;
                      lVar39 = 0;
                      pauVar6 = pauVar41;
                      do {
                        pauVar12 = pauVar6;
                        puVar20 = *pauVar41 + lVar39 * 8;
                        *puVar20 = *(undefined1 *)(lVar42 + local_58 + lVar39);
                        puVar20[1] = *(undefined1 *)(lVar42 + local_58 + 1 + lVar39);
                        puVar20[2] = *(undefined1 *)(lVar19 + lVar39);
                        puVar20[3] = *(undefined1 *)(lVar19 + 1 + lVar39);
                        puVar20[4] = *(undefined1 *)(lVar42 + local_40 + lVar39);
                        puVar20[5] = *(undefined1 *)(lVar42 + local_40 + 1 + lVar39);
                        puVar20[6] = *(undefined1 *)(lVar42 + local_48 + lVar39);
                        puVar20[7] = *(undefined1 *)(lVar42 + local_48 + 1 + lVar39);
                        puVar20[8] = *(undefined1 *)(lVar16 + lVar39);
                        puVar20[9] = *(undefined1 *)(lVar16 + 1 + lVar39);
                        puVar20[10] = *(undefined1 *)(lVar27 + lVar39);
                        puVar20[0xb] = *(undefined1 *)(lVar27 + 1 + lVar39);
                        puVar20[0xc] = *(undefined1 *)(lVar26 + lVar39);
                        puVar20[0xd] = *(undefined1 *)(lVar26 + 1 + lVar39);
                        puVar20[0xe] = *(undefined1 *)(lVar42 + local_60 + lVar39);
                        puVar20[0xf] = *(undefined1 *)(lVar42 + local_60 + 1 + lVar39);
                        lVar38 = lVar39 + 2;
                        iVar28 = (int)lVar39;
                        lVar39 = lVar38;
                        pauVar6 = (undefined1 (*) [16])(puVar20 + 0x10);
                      } while (iVar28 + 3 < (int)uVar18);
                      pauVar41 = pauVar12 + 1;
                      lVar38 = lVar42 + lVar38;
                      lVar39 = local_60 + lVar38;
                      local_f8 = (Mat *)(lVar40 + lVar38);
                      local_128 = local_128 + lVar38;
                      local_f0 = local_f0 + lVar38;
                      lVar16 = local_48 + lVar38;
                      lVar27 = local_40 + lVar38;
                      local_120 = local_120 + lVar38;
                      lVar38 = lVar38 + local_58;
                      uVar13 = local_c4;
                      local_e0 = uVar15;
                      local_50 = lVar42;
                      local_38 = lVar37;
                    }
                    if ((int)uVar13 < (int)uVar18) {
                      lVar42 = 0;
                      do {
                        (*pauVar41)[0] = *(undefined1 *)(lVar38 + lVar42);
                        (*pauVar41)[1] = *(undefined1 *)(local_120 + lVar42);
                        (*pauVar41)[2] = *(undefined1 *)(lVar27 + lVar42);
                        (*pauVar41)[3] = *(undefined1 *)(lVar16 + lVar42);
                        (*pauVar41)[4] = *(undefined1 *)(local_f0 + lVar42);
                        (*pauVar41)[5] = *(undefined1 *)(local_128 + lVar42);
                        (*pauVar41)[6] = *(undefined1 *)((long)&local_f8->data + lVar42);
                        (*pauVar41)[7] = *(undefined1 *)(lVar39 + lVar42);
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 8);
                        lVar42 = lVar42 + 1;
                      } while (uVar18 - uVar13 != (int)lVar42);
                    }
                    uVar14 = local_168 + 8;
                    uVar21 = local_168 + 0xf;
                    lVar11 = lVar11 + 8;
                    lVar37 = lVar37 + 8;
                    lVar36 = lVar36 + 8;
                    uVar15 = uVar15 + 8;
                    lVar23 = lVar23 + 8;
                    lVar35 = lVar35 + 8;
                    lVar34 = lVar34 + 8;
                    uVar7 = local_108 + 8;
                    local_168 = uVar14;
                  } while (uVar21 < local_100);
                }
                if ((int)((uint)uVar14 | 3) < (int)uVar9) {
                  local_108 = CONCAT44(local_108._4_4_,uVar18) & 0xfffffffffffffffe;
                  uVar15 = uVar14 & 0xffffffff;
                  lVar11 = local_a8 + uVar15;
                  lVar36 = local_b0 + uVar15;
                  lVar23 = local_b8 + uVar15;
                  local_168 = lVar10 + uVar15;
                  do {
                    lVar34 = (long)(this->super_Gemm).B_data.w;
                    sVar2 = (this->super_Gemm).B_data.elemsize;
                    pvVar3 = (this->super_Gemm).B_data.data;
                    if ((int)uVar18 < 2) {
                      lVar34 = sVar2 * lVar34;
                      lVar35 = (uVar15 + lVar10) * lVar34 + (long)iVar25;
                      lVar37 = (uVar15 + lVar10 + 1) * lVar34 + (long)iVar25;
                      lVar39 = (uVar15 + lVar10 + 2) * lVar34 + (long)iVar25;
                      lVar42 = (uVar15 + lVar10 + 3) * lVar34 + (long)iVar25;
                      iVar28 = 0;
                    }
                    else {
                      lVar42 = sVar2 * lVar11 * lVar34;
                      lVar38 = lVar42 + iVar25;
                      lVar39 = sVar2 * lVar36 * lVar34;
                      lVar27 = lVar39 + iVar25;
                      lVar37 = sVar2 * lVar23 * lVar34;
                      lVar16 = lVar37 + iVar25;
                      lVar34 = sVar2 * local_168 * lVar34;
                      lVar19 = lVar34 + iVar25;
                      pauVar6 = pauVar41;
                      lVar40 = 0;
                      do {
                        pauVar12 = pauVar6;
                        puVar20 = *pauVar41 + lVar40 * 4;
                        *puVar20 = *(undefined1 *)((long)pvVar3 + lVar40 + lVar19);
                        puVar20[1] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar19 + 1);
                        puVar20[2] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar16);
                        puVar20[3] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar16 + 1);
                        puVar20[4] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar27);
                        puVar20[5] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar27 + 1);
                        puVar20[6] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar38);
                        puVar20[7] = *(undefined1 *)((long)pvVar3 + lVar40 + lVar38 + 1);
                        lVar35 = lVar40 + 2;
                        iVar28 = (int)lVar40;
                        pauVar6 = (undefined1 (*) [16])(puVar20 + 8);
                        lVar40 = lVar35;
                      } while (iVar28 + 3 < (int)uVar18);
                      pauVar41 = (undefined1 (*) [16])(*pauVar12 + 8);
                      lVar35 = lVar35 + iVar25;
                      lVar42 = lVar42 + lVar35;
                      lVar39 = lVar39 + lVar35;
                      lVar37 = lVar37 + lVar35;
                      lVar35 = lVar34 + lVar35;
                      iVar28 = (int)local_108;
                    }
                    if (iVar28 < (int)uVar18) {
                      lVar34 = 0;
                      do {
                        (*pauVar41)[0] = *(undefined1 *)((long)pvVar3 + lVar34 + lVar35);
                        (*pauVar41)[1] = *(undefined1 *)((long)pvVar3 + lVar34 + lVar37);
                        (*pauVar41)[2] = *(undefined1 *)((long)pvVar3 + lVar34 + lVar39);
                        (*pauVar41)[3] = *(undefined1 *)((long)pvVar3 + lVar34 + lVar42);
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                        lVar34 = lVar34 + 1;
                      } while (uVar18 - iVar28 != (int)lVar34);
                    }
                    uVar14 = uVar15 + 4;
                    lVar34 = uVar15 + 7;
                    lVar11 = lVar11 + 4;
                    lVar36 = lVar36 + 4;
                    lVar23 = lVar23 + 4;
                    local_168 = local_168 + 4;
                    uVar15 = uVar14;
                  } while (lVar34 < (int)uVar9);
                }
                if ((int)((uint)uVar14 | 1) < (int)uVar9) {
                  uVar15 = uVar14 & 0xffffffff;
                  do {
                    lVar11 = (long)(this->super_Gemm).B_data.w * (this->super_Gemm).B_data.elemsize;
                    pvVar3 = (this->super_Gemm).B_data.data;
                    puVar20 = (undefined1 *)
                              ((long)pvVar3 + (uVar15 + lVar10) * lVar11 + (long)iVar25);
                    puVar31 = (undefined1 *)
                              ((long)pvVar3 + (lVar10 + uVar15 + 1) * lVar11 + (long)iVar25);
                    uVar13 = 0;
                    if (1 < (int)uVar18) {
                      iVar28 = 1;
                      do {
                        (*pauVar41)[0] = *puVar20;
                        (*pauVar41)[1] = puVar20[1];
                        (*pauVar41)[2] = *puVar31;
                        (*pauVar41)[3] = puVar31[1];
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 4);
                        puVar20 = puVar20 + 2;
                        puVar31 = puVar31 + 2;
                        iVar28 = iVar28 + 2;
                        uVar13 = uVar18 & 0xfffffffe;
                      } while (iVar28 < (int)uVar18);
                    }
                    if ((int)uVar13 < (int)uVar18) {
                      lVar11 = 0;
                      do {
                        (*pauVar41)[0] = puVar20[lVar11];
                        (*pauVar41)[1] = puVar31[lVar11];
                        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 2);
                        lVar11 = lVar11 + 1;
                      } while (uVar18 - uVar13 != (int)lVar11);
                    }
                    uVar14 = uVar15 + 2;
                    lVar11 = uVar15 + 3;
                    uVar15 = uVar14;
                  } while (lVar11 < (int)uVar9);
                }
                local_d0 = uVar32;
                local_70 = uVar17;
                if ((int)uVar14 < (int)uVar9) {
                  lVar11 = (long)(int)uVar14;
                  if ((int)uVar30 < (int)uVar32) {
                    uVar32 = uVar30;
                  }
                  lVar36 = lVar10 + lVar11;
                  do {
                    if (0 < (int)uVar18) {
                      iVar28 = (this->super_Gemm).B_data.w;
                      pvVar3 = (this->super_Gemm).B_data.data;
                      sVar2 = (this->super_Gemm).B_data.elemsize;
                      lVar23 = 0;
                      do {
                        (*pauVar41)[lVar23] =
                             *(undefined1 *)
                              ((long)pvVar3 + lVar23 + sVar2 * lVar36 * (long)iVar28 + (long)iVar25)
                        ;
                        lVar23 = lVar23 + 1;
                      } while (uVar32 != (uint)lVar23);
                      pauVar41 = (undefined1 (*) [16])(*pauVar41 + lVar23);
                    }
                    lVar11 = lVar11 + 1;
                    lVar36 = lVar36 + 1;
                  } while (lVar11 != (int)uVar9);
                }
              }
              uVar17 = (ulong)(uint)TILE_K;
              iVar25 = iVar25 + TILE_K;
            } while (iVar25 < (int)uVar33);
          }
          uVar9 = (int)local_98 + 1;
          uVar14 = (ulong)uVar9;
          local_68 = (ulong)uVar33;
        } while (uVar9 != local_e4);
      }
      if (local_c0->lightmode != false) {
        piVar4 = (this->super_Gemm).B_data.refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar3 = (this->super_Gemm).B_data.data;
            pAVar5 = (this->super_Gemm).B_data.allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar4 = (this->super_Gemm).C_data.refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->CT_data).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar3 = (this->CT_data).data;
          pAVar5 = (this->CT_data).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      piVar4 = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (this->super_Gemm).C_data.data;
      (this->CT_data).refcount = piVar4;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar25 = (this->super_Gemm).C_data.w;
      iVar28 = (this->super_Gemm).C_data.h;
      iVar24 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar25;
      (this->CT_data).h = iVar28;
      (this->CT_data).d = iVar24;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (opt->lightmode == true) {
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar3 = (this->super_Gemm).C_data.data;
            pAVar5 = (this->super_Gemm).C_data.allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar25 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = opt->num_threads;
      iVar25 = 0;
    }
  }
  else {
    uVar9 = (this->super_Gemm).constantM;
    iVar25 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk_int8
              (uVar9,0,iVar25,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar28 = TILE_M;
    uVar33 = TILE_K;
    local_100 = CONCAT44(local_100._4_4_,(int)(uVar9 + TILE_M + -1) / TILE_M);
    iVar24 = uVar33;
    local_e0 = (ulong)uVar9;
    if (3 < TILE_K) {
      iVar8 = cpu_support_x86_avx512_vnni();
      bVar43 = true;
      if (iVar8 == 0) {
        iVar8 = cpu_support_x86_avx_vnni();
        bVar43 = iVar8 != 0;
      }
      iVar8 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar43 ^ 1) && iVar8 == 0) {
        iVar24 = 0x40;
        if (((iVar28 < 0x10) && (iVar24 = 0x20, iVar28 < 8)) && (iVar24 = 0x10, iVar28 < 4)) {
          iVar24 = (uint)(1 < iVar28) * 4 + 4;
        }
        iVar24 = iVar24 + uVar33;
      }
    }
    Mat::create(&this->AT_data,iVar24 * iVar28,(int)(iVar25 + uVar33 + -1) / (int)uVar33,
                (uint)local_100,1,(Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      if (0 < (int)(uint)local_100) {
        local_f8 = &(this->super_Gemm).A_data;
        uVar17 = 0;
        do {
          local_d8 = uVar17;
          if (0 < iVar25) {
            iVar28 = TILE_M * (int)uVar17;
            local_f0 = CONCAT44(local_f0._4_4_,(int)local_e0 - iVar28);
            lVar10 = (long)iVar28;
            iVar24 = 0;
            do {
              uVar9 = (uint)local_f0;
              if (TILE_M < (int)(uint)local_f0) {
                uVar9 = TILE_M;
              }
              uVar32 = iVar25 - iVar24;
              if ((int)uVar33 < iVar25 - iVar24) {
                uVar32 = uVar33;
              }
              sVar2 = (this->AT_data).elemsize;
              AT = (Mat *)((long)(this->AT_data).data +
                          (long)(this->AT_data).w * sVar2 * (long)(iVar24 / (int)uVar33) +
                          (long)(iVar28 / TILE_M) * (this->AT_data).cstep * sVar2);
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile_int8(local_f8,AT,iVar28,uVar9,iVar24,uVar32);
              }
              else {
                iVar8 = (this->super_Gemm).A_data.w;
                lVar11 = (long)iVar8;
                uVar17 = 0;
                local_108 = CONCAT44(local_108._4_4_,uVar9);
                if (3 < (int)uVar9) {
                  lVar35 = (long)(iVar8 * 2);
                  lVar37 = (iVar8 + 3) + lVar10;
                  lVar39 = (iVar8 + 2) + lVar10;
                  lVar34 = (iVar8 + 1) + lVar10;
                  lVar36 = lVar11 + lVar10;
                  uVar14 = 0;
                  lVar23 = lVar10;
                  do {
                    pvVar3 = (this->super_Gemm).A_data.data;
                    lVar42 = (long)(this->super_Gemm).A_data.w * (long)iVar24 *
                             (this->super_Gemm).A_data.elemsize;
                    if ((int)uVar32 < 2) {
                      lVar38 = (long)pvVar3 + lVar10 + uVar14;
                      uVar33 = 0;
                    }
                    else {
                      lVar38 = (long)pvVar3 + lVar23;
                      lVar16 = lVar37 + (long)pvVar3;
                      lVar40 = lVar39 + (long)pvVar3;
                      lVar27 = (long)pvVar3 + lVar34;
                      lVar19 = (long)pvVar3 + lVar36;
                      iVar29 = 1;
                      do {
                        *(undefined1 *)&AT->data = *(undefined1 *)(lVar38 + lVar42);
                        *(undefined1 *)((long)&AT->data + 1) = *(undefined1 *)(lVar19 + lVar42);
                        *(undefined1 *)((long)&AT->data + 2) = *(undefined1 *)(lVar38 + 1 + lVar42);
                        *(undefined1 *)((long)&AT->data + 3) = *(undefined1 *)(lVar27 + lVar42);
                        *(undefined1 *)((long)&AT->data + 4) = *(undefined1 *)(lVar38 + 2 + lVar42);
                        *(undefined1 *)((long)&AT->data + 5) = *(undefined1 *)(lVar40 + lVar42);
                        *(undefined1 *)((long)&AT->data + 6) = *(undefined1 *)(lVar38 + 3 + lVar42);
                        *(undefined1 *)((long)&AT->data + 7) = *(undefined1 *)(lVar16 + lVar42);
                        AT = (Mat *)&AT->refcount;
                        iVar29 = iVar29 + 2;
                        lVar38 = lVar38 + lVar35;
                        lVar16 = lVar16 + lVar35;
                        lVar40 = lVar40 + lVar35;
                        lVar27 = lVar27 + lVar35;
                        lVar19 = lVar19 + lVar35;
                      } while (iVar29 < (int)uVar32);
                      uVar33 = uVar32 & 0xfffffffe;
                    }
                    iVar29 = uVar32 - uVar33;
                    if (iVar29 != 0 && (int)uVar33 <= (int)uVar32) {
                      puVar20 = (undefined1 *)(lVar38 + lVar42 + 3);
                      do {
                        *(undefined1 *)&AT->data = puVar20[-3];
                        *(undefined1 *)((long)&AT->data + 1) = puVar20[-2];
                        *(undefined1 *)((long)&AT->data + 2) = puVar20[-1];
                        *(undefined1 *)((long)&AT->data + 3) = *puVar20;
                        AT = (Mat *)((long)&AT->data + 4);
                        puVar20 = puVar20 + lVar11;
                        iVar29 = iVar29 + -1;
                      } while (iVar29 != 0);
                    }
                    uVar17 = uVar14 + 4;
                    uVar15 = uVar14 + 7;
                    lVar23 = lVar23 + 4;
                    lVar37 = lVar37 + 4;
                    lVar39 = lVar39 + 4;
                    lVar34 = lVar34 + 4;
                    lVar36 = lVar36 + 4;
                    uVar14 = uVar17;
                  } while (uVar15 < uVar9);
                }
                if ((int)((uint)uVar17 | 1) < (int)uVar9) {
                  lVar35 = (long)(iVar8 * 2);
                  lVar36 = lVar10 + (uVar17 & 0xffffffff);
                  lVar34 = (iVar8 + 1) + lVar36;
                  lVar23 = lVar36 + lVar11;
                  uVar14 = uVar17 & 0xffffffff;
                  do {
                    pvVar3 = (this->super_Gemm).A_data.data;
                    lVar37 = (long)(this->super_Gemm).A_data.w * (long)iVar24 *
                             (this->super_Gemm).A_data.elemsize;
                    if ((int)uVar32 < 2) {
                      lVar39 = (long)pvVar3 + lVar10 + uVar14;
                      uVar33 = 0;
                    }
                    else {
                      lVar39 = (long)pvVar3 + lVar36;
                      lVar42 = (long)pvVar3 + lVar34;
                      lVar38 = (long)pvVar3 + lVar23;
                      iVar8 = 1;
                      do {
                        *(undefined1 *)&AT->data = *(undefined1 *)(lVar39 + lVar37);
                        *(undefined1 *)((long)&AT->data + 1) = *(undefined1 *)(lVar38 + lVar37);
                        *(undefined1 *)((long)&AT->data + 2) = *(undefined1 *)(lVar39 + 1 + lVar37);
                        *(undefined1 *)((long)&AT->data + 3) = *(undefined1 *)(lVar42 + lVar37);
                        AT = (Mat *)((long)&AT->data + 4);
                        iVar8 = iVar8 + 2;
                        lVar39 = lVar39 + lVar35;
                        lVar42 = lVar42 + lVar35;
                        lVar38 = lVar38 + lVar35;
                      } while (iVar8 < (int)uVar32);
                      uVar33 = uVar32 & 0xfffffffe;
                    }
                    iVar8 = uVar32 - uVar33;
                    if (iVar8 != 0 && (int)uVar33 <= (int)uVar32) {
                      puVar20 = (undefined1 *)(lVar39 + lVar37 + 1);
                      do {
                        *(undefined1 *)&AT->data = puVar20[-1];
                        *(undefined1 *)((long)&AT->data + 1) = *puVar20;
                        AT = (Mat *)((long)&AT->data + 2);
                        puVar20 = puVar20 + lVar11;
                        iVar8 = iVar8 + -1;
                      } while (iVar8 != 0);
                    }
                    uVar17 = uVar14 + 2;
                    lVar37 = uVar14 + 3;
                    lVar36 = lVar36 + 2;
                    lVar34 = lVar34 + 2;
                    lVar23 = lVar23 + 2;
                    uVar14 = uVar17;
                  } while (lVar37 < (int)uVar9);
                }
                if ((int)uVar17 < (int)uVar9) {
                  uVar17 = uVar17 & 0xffffffff;
                  do {
                    if (0 < (int)uVar32) {
                      puVar20 = (undefined1 *)
                                ((long)(this->super_Gemm).A_data.data +
                                lVar10 + uVar17 +
                                (long)(this->super_Gemm).A_data.w * (long)iVar24 *
                                (this->super_Gemm).A_data.elemsize);
                      uVar33 = uVar32;
                      do {
                        *(undefined1 *)&AT->data = *puVar20;
                        AT = (Mat *)((long)&AT->data + 1);
                        puVar20 = puVar20 + lVar11;
                        uVar33 = uVar33 - 1;
                      } while (uVar33 != 0);
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 != uVar9);
                }
              }
              iVar24 = iVar24 + TILE_K;
              uVar33 = TILE_K;
            } while (iVar24 < iVar25);
          }
          uVar9 = (int)local_d8 + 1;
          uVar17 = (ulong)uVar9;
        } while (uVar9 != (uint)local_100);
      }
      opt = local_c0;
      if (local_c0->lightmode != false) {
        piVar4 = (this->super_Gemm).A_data.refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar3 = (this->super_Gemm).A_data.data;
            pAVar5 = (this->super_Gemm).A_data.allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_0047e6c7;
    }
LAB_0047f515:
    iVar25 = -100;
  }
  return iVar25;
}

Assistant:

int Gemm_x86::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}